

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O3

string * __thiscall
cmUuid::FromSha1(string *__return_storage_ptr__,cmUuid *this,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace,string *name)

{
  cmCryptoHash sha1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashInput;
  vector<unsigned_char,_std::allocator<unsigned_char>_> digest;
  cmCryptoHash cStack_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  ulong local_28;
  ulong uStack_20;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateHashInput((cmUuid *)__return_storage_ptr__,uuidNamespace,name,&local_58);
  cmCryptoHash::cmCryptoHash(&cStack_68,AlgoSHA1);
  cmCryptoHash::Initialize(&cStack_68);
  cmCryptoHash::Append
            (&cStack_68,
             local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  cmCryptoHash::Finalize(&local_40,&cStack_68);
  local_28 = *(ulong *)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start & 0xff0fffffffffffff |
             0x50000000000000;
  uStack_20 = *(ulong *)((long)local_40.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + 8) & 0xffffffffffffff3f |
              0x80;
  BinaryToString_abi_cxx11_(__return_storage_ptr__,this,(uchar *)&local_28);
  if ((ulong *)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  cmCryptoHash::~cmCryptoHash(&cStack_68);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::FromSha1(std::vector<unsigned char> const& uuidNamespace,
                             std::string const& name) const
{
  std::vector<unsigned char> hashInput;
  this->CreateHashInput(uuidNamespace, name, hashInput);

  cmCryptoHash sha1(cmCryptoHash::AlgoSHA1);
  sha1.Initialize();
  sha1.Append(&hashInput[0], hashInput.size());
  std::vector<unsigned char> digest = sha1.Finalize();

  return this->FromDigest(&digest[0], 5);
}